

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

Text loguru::ec_to_text(EcHandle ec_handle)

{
  size_t sVar1;
  _func_int **pp_Var2;
  EcEntryBase *unaff_R15;
  Text parent_ec;
  char *local_20;
  
  get_error_context_for(unaff_R15);
  sVar1 = strlen(local_20);
  pp_Var2 = (_func_int **)malloc(sVar1 + 2);
  *(undefined1 *)pp_Var2 = 10;
  strcpy((char *)((long)pp_Var2 + 1),local_20);
  ec_handle->_vptr_EcEntryBase = pp_Var2;
  free(local_20);
  return (Text)(char *)ec_handle;
}

Assistant:

Text ec_to_text(EcHandle ec_handle)
	{
		Text parent_ec = get_error_context_for(ec_handle);
		size_t buffer_size = strlen(parent_ec.c_str()) + 2;
		char* with_newline = reinterpret_cast<char*>(malloc(buffer_size));
		with_newline[0] = '\n';
	#ifdef _WIN32
		strncpy_s(with_newline + 1, buffer_size, parent_ec.c_str(), buffer_size - 2);
	#else
		strcpy(with_newline + 1, parent_ec.c_str());
	#endif
		return Text(with_newline);
	}